

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O0

void __thiscall diffusion::FileWriter::FileWriter(FileWriter *this,string *file_name)

{
  exception *e;
  string *file_name_local;
  FileWriter *this_local;
  
  Writer::Writer(&this->super_Writer);
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00109cd8;
  std::ofstream::ofstream(&this->file_);
  std::ofstream::open(&this->file_,file_name,0x10);
  write_file_header(this);
  return;
}

Assistant:

FileWriter::FileWriter(std::string const & file_name) {
    try {
        file_.open(file_name);
    } catch (std::exception const & e) {
        throw ErrorFileOpening();
    }
    this->write_file_header();
}